

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O2

void __thiscall
std::pmr::test_resource::test_resource
          (test_resource *this,string_view name,bool verbose,memory_resource *pmrp)

{
  test_resource_list *ptVar1;
  undefined3 in_register_00000009;
  
  *(undefined ***)this = &PTR__test_resource_00106cb0;
  (this->m_name_)._M_len = name._M_len;
  (this->m_name_)._M_str = name._M_str;
  this->m_no_abort_flag_ = (__atomic_base<int>)0x0;
  this->m_quiet_flag_ = (__atomic_base<int>)0x0;
  (this->m_verbose_flag_).super___atomic_base<int>._M_i = CONCAT31(in_register_00000009,verbose);
  (this->m_allocation_limit_).super___atomic_base<long_long>._M_i = -1;
  memset(&this->m_allocations_,0,0xb8);
  this->m_pmr_ = pmrp;
  ptVar1 = (test_resource_list *)(**(code **)(*(long *)pmrp + 0x10))(pmrp,0x10);
  this->m_list_ = ptVar1;
  ptVar1->d_head_p = (Link *)0x0;
  ptVar1->d_tail_p = (Link *)0x0;
  return;
}

Assistant:

test_resource::test_resource(string_view      name,
                             bool             verbose,
                             memory_resource *pmrp)
: m_name_(name)
, m_verbose_flag_(verbose)
, m_pmr_(pmrp)
{
    m_list_ = (test_resource_list *)m_pmr_->allocate(
                                                   sizeof(test_resource_list));
    m_list_->d_head_p = nullptr;
    m_list_->d_tail_p = nullptr;
}